

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall fmt::v10::detail::bigint::assign_pow10(bigint *this,int exp)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  if (exp < 0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format.h"
                ,0xb92,"");
  }
  else if (exp == 0) {
    assign<unsigned_long,_0>(this,1);
    return;
  }
  uVar3 = 1;
  do {
    uVar2 = uVar3;
    uVar3 = uVar2 * 2;
  } while ((int)uVar2 <= exp);
  assign<unsigned_long,_0>(this,5);
  if (3 < uVar2) {
    uVar3 = (int)uVar2 >> 2;
    do {
      square(this);
      if ((uVar3 & exp) != 0) {
        multiply(this,5);
      }
      bVar1 = 1 < uVar3;
      uVar3 = (int)uVar3 >> 1;
    } while (bVar1);
  }
  operator<<=(this,exp);
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign_pow10(int exp) {
    FMT_ASSERT(exp >= 0, "");
    if (exp == 0) return *this = 1;
    // Find the top bit.
    int bitmask = 1;
    while (exp >= bitmask) bitmask <<= 1;
    bitmask >>= 1;
    // pow(10, exp) = pow(5, exp) * pow(2, exp). First compute pow(5, exp) by
    // repeated squaring and multiplication.
    *this = 5;
    bitmask >>= 1;
    while (bitmask != 0) {
      square();
      if ((exp & bitmask) != 0) *this *= 5;
      bitmask >>= 1;
    }
    *this <<= exp;  // Multiply by pow(2, exp) by shifting.
  }